

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMemory.c
# Opt level: O0

void * sbfMemory_realloc(void *ptr,size_t nmemb,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong in_RDX;
  ulong in_RSI;
  void *in_RDI;
  size_t newsize;
  
  if (in_RSI * in_RDX == 0) {
    sbfFatal_die((char *)0x109867);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < in_RDX) {
    sbfFatal_die((char *)0x10988a);
  }
  pvVar2 = realloc(in_RDI,in_RSI * in_RDX);
  if (pvVar2 == (void *)0x0) {
    sbfFatal_die((char *)0x1098b2);
  }
  return pvVar2;
}

Assistant:

void*
sbfMemory_realloc (void* ptr, size_t nmemb, size_t size)
{
    size_t newsize;

    newsize = nmemb * size;
    if (newsize == 0)
        SBF_FATAL ("zero size");
    if (SIZE_MAX / nmemb < size)
        SBF_FATAL ("size too big");

    ptr = realloc (ptr, newsize);
    if (ptr == NULL)
        SBF_FATAL ("out of memory");
    return ptr;
}